

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobotDynamics.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
RobotDynamics::getTau
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,RobotDynamics *this,
          double G,vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                   *R,
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *P,vector<double,_std::allocator<double>_> *theta_d,
          vector<double,_std::allocator<double>_> *theta_dd)

{
  undefined8 *puVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  uint uVar8;
  pointer pMVar9;
  pointer pMVar10;
  iterator __position;
  long lVar11;
  long lVar12;
  double dVar13;
  vector<Eigen::Matrix<double,3,3,0,3,3>,std::allocator<Eigen::Matrix<double,3,3,0,3,3>>> *pvVar14;
  vector<double,_std::allocator<double>_> *pvVar15;
  pointer pMVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  Matrix<double,_3,_3,_0,_3,_3> *pMVar20;
  iterator __position_00;
  long lVar21;
  byte bVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  Matrix3d identity_mat;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  w_d;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  w;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  F;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  v_d;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  n;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  f;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  N;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  vC_d;
  assign_op<double,_double> local_279;
  SrcXprType local_278;
  double *pdStack_270;
  double local_268;
  double local_260;
  Matrix<double,_3,_3,_0,_3,_3> local_258;
  XprTypeNested *local_210;
  Matrix<double,_3,_3,_0,_3,_3> *pMStack_208;
  double *local_200;
  undefined8 local_1f8;
  XprTypeNested local_1d8;
  double *pdStack_1d0;
  double local_1c8;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  vector<Eigen::Matrix<double,3,3,0,3,3>,std::allocator<Eigen::Matrix<double,3,3,0,3,3>>> *local_1a0
  ;
  Matrix<double,_3,_3,_0,_3,_3> local_198;
  double *local_148;
  double local_138;
  undefined8 uStack_130;
  vector<double,_std::allocator<double>_> *local_120;
  RobotDynamics *local_118;
  vector<double,_std::allocator<double>_> *local_110;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_108;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_f0;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_d8;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_c0;
  vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>> *local_a8;
  vector<double,_std::allocator<double>_> *local_a0;
  long local_98;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_90;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_78;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_60;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_48;
  
  bVar22 = 0;
  uVar19 = (ulong)this->JOINT_NUM;
  local_110 = theta_dd;
  if (((long)(R->
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             )._M_impl.super__Vector_impl_data._M_finish -
       (long)(R->
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7 - uVar19 != 0) {
    __assert_fail("JOINT_NUM == R.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/notlixiang[P]Robot-Arm-Dynamics-Library/RobotDynamics.cpp"
                  ,0x1a,
                  "vector<double> RobotDynamics::getTau(double, vector<Eigen::Matrix3d>, vector<Eigen::Vector3d>, vector<double>, vector<double>)"
                 );
  }
  if (((long)(P->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish -
       (long)(P->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - uVar19 != 0) {
    __assert_fail("JOINT_NUM == P.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/notlixiang[P]Robot-Arm-Dynamics-Library/RobotDynamics.cpp"
                  ,0x1b,
                  "vector<double> RobotDynamics::getTau(double, vector<Eigen::Matrix3d>, vector<Eigen::Vector3d>, vector<double>, vector<double>)"
                 );
  }
  if ((long)(theta_d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(theta_d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 != uVar19) {
    __assert_fail("JOINT_NUM == theta_d.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/notlixiang[P]Robot-Arm-Dynamics-Library/RobotDynamics.cpp"
                  ,0x1c,
                  "vector<double> RobotDynamics::getTau(double, vector<Eigen::Matrix3d>, vector<Eigen::Vector3d>, vector<double>, vector<double>)"
                 );
  }
  local_260 = G;
  if ((long)(theta_dd->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(theta_dd->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 == uVar19) {
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::vector(&local_f0,(ulong)(this->JOINT_NUM + 1),(allocator_type *)&local_258);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::vector(&local_108,(ulong)(this->JOINT_NUM + 1),(allocator_type *)&local_258);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::vector(&local_c0,(ulong)(this->JOINT_NUM + 1),(allocator_type *)&local_258);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::vector(&local_48,(ulong)(this->JOINT_NUM + 1),(allocator_type *)&local_258);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::vector(&local_d8,(ulong)(this->JOINT_NUM + 1),(allocator_type *)&local_258);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::vector(&local_60,(ulong)(this->JOINT_NUM + 1),(allocator_type *)&local_258);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::vector(&local_78,(ulong)(this->JOINT_NUM + 2),(allocator_type *)&local_258);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::vector(&local_90,(ulong)(this->JOINT_NUM + 2),(allocator_type *)&local_258);
    uVar8 = this->JOINT_NUM;
    if (uVar8 + 1 != 0) {
      lVar17 = 0;
      do {
        puVar1 = (undefined8 *)
                 ((long)((local_f0.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                        m_data.array + lVar17);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)
         ((long)((local_f0.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         + lVar17 + 0x10) = 0;
        *(undefined8 *)
         ((long)((local_108.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         + lVar17 + 0x10) = 0;
        puVar1 = (undefined8 *)
                 ((long)((local_108.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                        m_data.array + lVar17);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)
         ((long)((local_c0.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         + lVar17 + 0x10) = 0;
        puVar1 = (undefined8 *)
                 ((long)((local_c0.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                        m_data.array + lVar17);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)
         ((long)((local_48.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         + lVar17 + 0x10) = 0;
        puVar1 = (undefined8 *)
                 ((long)((local_48.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                        m_data.array + lVar17);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)
         ((long)((local_d8.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         + lVar17 + 0x10) = 0;
        puVar1 = (undefined8 *)
                 ((long)((local_d8.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                        m_data.array + lVar17);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)
         ((long)((local_60.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         + lVar17 + 0x10) = 0;
        puVar1 = (undefined8 *)
                 ((long)((local_60.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                        m_data.array + lVar17);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar17 = lVar17 + 0x18;
      } while ((ulong)(uVar8 + 1) * 0x18 != lVar17);
    }
    if (uVar8 + 2 != 0) {
      lVar17 = 0;
      do {
        puVar1 = (undefined8 *)
                 ((long)((local_78.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                        m_data.array + lVar17);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)
         ((long)((local_78.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         + lVar17 + 0x10) = 0;
        *(undefined8 *)
         ((long)((local_90.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         + lVar17 + 0x10) = 0;
        puVar1 = (undefined8 *)
                 ((long)((local_90.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                        m_data.array + lVar17);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar17 = lVar17 + 0x18;
      } while ((ulong)(uVar8 + 2) * 0x18 != lVar17);
    }
    local_1a0 = (vector<Eigen::Matrix<double,3,3,0,3,3>,std::allocator<Eigen::Matrix<double,3,3,0,3,3>>>
                 *)R;
    local_120 = __return_storage_ptr__;
    std::vector<double,_std::allocator<double>_>::vector
              (__return_storage_ptr__,(ulong)uVar8,(allocator_type *)&local_258);
    local_1b8 = 0.0;
    dStack_1b0 = 0.0;
    local_1a8 = 1.0;
    ((local_c0.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] = 0.0;
    ((local_c0.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] = 0.0;
    ((local_c0.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
         local_260;
    local_118 = this;
    if (this->JOINT_NUM != 0) {
      lVar18 = 0;
      lVar17 = 0;
      dVar23 = 0.0;
      local_a8 = (vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)P;
      local_a0 = theta_d;
      do {
        pvVar15 = local_a0;
        pMVar16 = local_f0.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar14 = local_1a0;
        local_278.m_xpr = (XprTypeNested)(*(long *)local_1a0 + lVar17);
        pdStack_270 = (double *)
                      ((long)((local_f0.
                               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                             .m_data.array + lVar18);
        local_138 = (local_a0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[(long)dVar23];
        uStack_130 = 0;
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = (double)(local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array + 2);
        local_260 = dVar23;
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run(&local_258,&local_278,(assign_op<double,_double> *)&local_1d8);
        pMVar9 = local_108.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        dVar27 = local_260;
        local_210 = (XprTypeNested *)pdStack_270;
        local_200 = pdStack_270;
        local_1f8 = 3;
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = pdStack_270[2] *
                   local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[6] +
                   pdStack_270[1] *
                   local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[3] +
                   *pdStack_270 *
                   local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[0];
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] = pdStack_270[2] *
                   local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[7] +
                   pdStack_270[1] *
                   local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[4] +
                   *pdStack_270 *
                   local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[1];
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[4] = local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[8] * pdStack_270[2] +
                   local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[5] * pdStack_270[1] +
                   local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[2] * *pdStack_270;
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] = local_138;
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] = (double)&local_1b8;
        dVar23 = *(double *)
                  ((long)local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[1] + 8);
        pdVar2 = (double *)
                 ((long)pMVar16[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array + lVar18);
        *pdVar2 = local_138 * local_1b8 +
                  *(double *)
                   local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[1];
        pdVar2[1] = local_138 * dStack_1b0 + dVar23;
        *(double *)
         ((long)pMVar16[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + lVar18 + 0x10) =
             local_138 * local_1a8 +
             *(double *)
              ((long)local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[1] + 0x10);
        lVar21 = *(long *)pvVar14;
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = (double)((long)((local_f0.
                                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                  m_storage.m_data.array + lVar18);
        local_138 = (pvVar15->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[(long)local_260];
        pMStack_208 = &local_258;
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = (double)(lVar21 + lVar17);
        local_98 = lVar17;
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run(&local_258,(SrcXprType *)&local_198,(assign_op<double,_double> *)&local_1d8);
        pMVar16 = local_108.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pdStack_1d0 = (double *)
                      ((long)(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                             m_storage.m_data.array + lVar18);
        local_210 = (XprTypeNested *)
                    local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[1];
        local_200 = (double *)
                    local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[1];
        local_1f8 = 3;
        dVar23 = *(double *)
                  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1];
        dVar5 = *(double *)
                 ((long)local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[1] + 8);
        dVar28 = *(double *)
                  ((long)local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[1] + 0x10);
        dVar24 = dVar28 * local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[6] +
                 dVar5 * local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[3] +
                 dVar23 * local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[0];
        dVar25 = dVar28 * local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[7] +
                 dVar5 * local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[4] +
                 dVar23 * local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[1];
        dVar23 = dVar28 * local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[8] +
                 dVar5 * local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[5] +
                 dVar23 * local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[2];
        local_278.m_xpr =
             (XprTypeNested)(dVar25 * local_1a8 * local_138 - dStack_1b0 * local_138 * dVar23);
        pdStack_270 = (double *)(dVar23 * local_138 * local_1b8 - local_1a8 * local_138 * dVar24);
        local_268 = dStack_1b0 * local_138 * dVar24 - local_138 * local_1b8 * dVar25;
        local_138 = (local_110->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[(long)dVar27];
        uStack_130 = 0;
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = (double)(local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array + 3);
        pMStack_208 = &local_258;
        local_1d8 = (XprTypeNested)(lVar21 + lVar17);
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run(&local_258,(SrcXprType *)&local_1d8,&local_279);
        lVar17 = local_98;
        P = (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)local_a8;
        pMVar9 = local_c0.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_210 = (XprTypeNested *)pdStack_1d0;
        local_200 = pdStack_1d0;
        local_1f8 = 3;
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[4] = pdStack_1d0[2] *
                   local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[7] +
                   pdStack_1d0[1] *
                   local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[4] +
                   *pdStack_1d0 *
                   local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[1];
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] = (double)&local_278;
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] = local_138;
        local_148 = &local_1b8;
        dVar23 = *(double *)
                  ((long)local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[2] + 8);
        pdVar2 = (double *)
                 ((long)pMVar16[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array + lVar18);
        *pdVar2 = local_138 * local_1b8 +
                  *(double *)
                   local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[2] + (double)local_278.m_xpr;
        pdVar2[1] = local_138 * dStack_1b0 + dVar23 + (double)pdStack_270;
        *(double *)
         ((long)pMVar16[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + lVar18 + 0x10) =
             local_138 * local_1a8 +
             *(double *)
              ((long)local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[2] + 0x10) + local_268;
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = (double)(*(long *)local_1a0 + local_98);
        lVar21 = *(long *)local_a8;
        dVar23 = *(double *)
                  ((long)((local_108.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                         m_data.array + lVar18);
        dVar5 = *(double *)
                 ((long)((local_108.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                        m_data.array + lVar18 + 8);
        dVar28 = *(double *)(lVar21 + 0x10 + lVar18);
        dVar27 = *(double *)
                  ((long)((local_108.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                         m_data.array + lVar18 + 0x10);
        dVar24 = *(double *)(lVar21 + 8 + lVar18);
        local_278.m_xpr = (XprTypeNested)(dVar5 * dVar28 - dVar24 * dVar27);
        pdStack_270 = (double *)(dVar27 * *(double *)(lVar21 + lVar18) - dVar28 * dVar23);
        local_268 = dVar23 * dVar24 - *(double *)(lVar21 + lVar18) * dVar5;
        dVar23 = *(double *)
                  ((long)((local_f0.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                         m_data.array + lVar18);
        dVar5 = *(double *)
                 ((long)((local_f0.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                        m_data.array + lVar18 + 8);
        dVar28 = *(double *)(lVar21 + 0x10 + lVar18);
        dVar27 = *(double *)
                  ((long)((local_f0.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                         m_data.array + lVar18 + 0x10);
        dVar24 = *(double *)(lVar21 + 8 + lVar18);
        dVar25 = dVar5 * dVar28 - dVar24 * dVar27;
        dVar29 = dVar27 * *(double *)(lVar21 + lVar18) - dVar28 * dVar23;
        dVar28 = dVar24 * dVar23 - *(double *)(lVar21 + lVar18) * dVar5;
        local_1d8 = (XprTypeNested)(dVar5 * dVar28 - dVar29 * dVar27);
        pdStack_1d0 = (double *)(dVar27 * dVar25 - dVar28 * dVar23);
        local_1c8 = dVar29 * dVar23 - dVar25 * dVar5;
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] = (double)((long)((local_c0.
                                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                  m_storage.m_data.array + lVar18);
        pMStack_208 = &local_258;
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[6];
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] = (double)&local_1d8;
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run(&local_258,(SrcXprType *)&local_198,&local_279);
        local_210 = (XprTypeNested *)
                    (*(double *)
                      local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[5] +
                    *(double *)
                     local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[3] +
                    (double)*(XprTypeNested *)
                             local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array[2]);
        pMStack_208 = (Matrix<double,_3,_3,_0,_3,_3> *)
                      (*(double *)
                        ((long)local_198.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array[5] + 8) +
                      *(double *)
                       ((long)local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                              .m_storage.m_data.array[3] + 8) +
                      (double)((SrcXprType *)
                              ((long)local_198.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                     m_storage.m_data.array[2] + 8))->m_xpr);
        dVar23 = (double)((SrcXprType *)
                         ((long)local_198.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[2] + 0x10))->m_xpr +
                 *(double *)
                  ((long)local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[3] + 0x10) +
                 *(double *)
                  ((long)local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[5] + 0x10);
        pdVar2 = (double *)
                 ((long)pMVar9[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array + lVar18);
        *pdVar2 = dVar23 * local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[6] +
                  (double)pMStack_208 *
                  local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[3] +
                  (double)local_210 *
                  local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[0];
        pdVar2[1] = dVar23 * local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array[7] +
                    (double)pMStack_208 *
                    local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[4] +
                    (double)local_210 *
                    local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[1];
        *(double *)
         ((long)pMVar9[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + lVar18 + 0x10) =
             dVar23 * local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[8] +
             (double)pMStack_208 *
             local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] +
             (double)local_210 *
             local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2];
        pMVar9 = (local_118->PC).
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        dVar23 = *(double *)
                  ((long)local_108.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array + lVar18);
        dVar5 = *(double *)
                 ((long)local_108.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + lVar18 + 8);
        dVar28 = *(double *)
                  ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                          m_storage.m_data + lVar18 + 0x10);
        dVar27 = *(double *)
                  ((long)local_108.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array + lVar18 + 0x10);
        dVar24 = *(double *)
                  ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                          m_storage.m_data + lVar18);
        dVar25 = *(double *)
                  ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                          m_storage.m_data + lVar18 + 8);
        dVar29 = *(double *)
                  ((long)local_f0.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array + lVar18);
        dVar6 = *(double *)
                 ((long)local_f0.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + lVar18 + 8);
        dVar7 = *(double *)
                 ((long)local_f0.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + lVar18 + 0x10);
        dVar30 = dVar6 * dVar28 - dVar25 * dVar7;
        dVar26 = dVar7 * dVar24 - dVar28 * dVar29;
        dVar31 = dVar29 * dVar25 - dVar24 * dVar6;
        pdVar2 = (double *)
                 ((long)local_c0.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + lVar18);
        dVar13 = pdVar2[1];
        pdVar3 = (double *)
                 ((long)local_48.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + lVar18);
        *pdVar3 = *pdVar2 + (dVar6 * dVar31 - dVar26 * dVar7) + (dVar5 * dVar28 - dVar25 * dVar27);
        pdVar3[1] = dVar13 + (dVar7 * dVar30 - dVar31 * dVar29) +
                             (dVar27 * dVar24 - dVar28 * dVar23);
        *(double *)
         ((long)local_48.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1].
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
         + lVar18 + 0x10) =
             (dVar26 * dVar29 - dVar30 * dVar6) + (dVar23 * dVar25 - dVar24 * dVar5) +
             *(double *)
              ((long)local_c0.
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array + lVar18 + 0x10);
        dVar23 = (local_118->m).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)local_260];
        pdVar2 = (double *)
                 ((long)local_48.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + lVar18);
        dVar5 = pdVar2[1];
        pdVar3 = (double *)
                 ((long)local_d8.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + lVar18);
        *pdVar3 = *pdVar2 * dVar23;
        pdVar3[1] = dVar5 * dVar23;
        *(double *)
         ((long)local_d8.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1].
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
         + lVar18 + 0x10) =
             dVar23 * *(double *)
                       ((long)local_48.
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array + lVar18 + 0x10);
        pMVar10 = (local_118->I).
                  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        dVar5 = *(double *)
                 ((long)local_f0.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + lVar18);
        dVar23 = *(double *)
                  ((long)local_f0.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array + lVar18 + 8);
        pdVar2 = (double *)
                 ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data + lVar17);
        pdVar3 = (double *)
                 ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data + lVar17 + 0x18);
        pdVar4 = (double *)
                 ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data + lVar17 + 0x30);
        dVar28 = *(double *)
                  ((long)local_f0.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array + lVar18 + 0x10);
        dVar25 = dVar28 * *pdVar4 + dVar23 * *pdVar3 + *pdVar2 * dVar5;
        dVar27 = dVar28 * pdVar4[1] + dVar23 * pdVar3[1] + pdVar2[1] * dVar5;
        dVar29 = *(double *)
                  ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data + lVar17 + 0x40) * dVar28 +
                 *(double *)
                  ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data + lVar17 + 0x28) * dVar23 +
                 *(double *)
                  ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data + lVar17 + 0x10) * dVar5;
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = dVar23 * dVar29 - dVar27 * dVar28;
        local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = dVar27 * dVar5 - dVar25 * dVar23;
        local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = (double)(local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array + 2);
        dVar23 = *(double *)
                  ((long)local_108.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array + lVar18);
        dVar27 = *(double *)
                  ((long)local_108.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array + lVar18 + 8);
        dVar24 = *(double *)
                  ((long)local_108.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array + lVar18 + 0x10);
        pdVar2 = (double *)
                 ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data + lVar17);
        pdVar3 = (double *)
                 ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data + lVar17 + 0x18);
        pdVar4 = (double *)
                 ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data + lVar17 + 0x30);
        local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = dVar24 * *pdVar4 + dVar27 * *pdVar3 + *pdVar2 * dVar23;
        local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] = dVar24 * pdVar4[1] + dVar27 * pdVar3[1] + pdVar2[1] * dVar23;
        dVar23 = (double)((long)local_260 + 1);
        local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[4] = *(double *)
                    ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + lVar17 + 0x40) *
                   *(double *)
                    ((long)local_108.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array + lVar18 + 0x10) +
                   *(double *)
                    ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + lVar17 + 0x28) *
                   *(double *)
                    ((long)local_108.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array + lVar18 + 8) +
                   *(double *)
                    ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + lVar17 + 0x10) *
                   *(double *)
                    ((long)local_108.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array + lVar18);
        pdVar2 = (double *)
                 ((long)local_60.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + lVar18);
        *pdVar2 = local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[2] +
                  local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[0];
        pdVar2[1] = local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[3] + (dVar28 * dVar25 - dVar29 * dVar5);
        *(double *)
         ((long)local_60.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1].
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
         + lVar18 + 0x10) =
             local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] +
             local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2];
        lVar17 = lVar17 + 0x48;
        lVar18 = lVar18 + 0x18;
        theta_d = local_a0;
        local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] = (double)&local_198;
      } while ((ulong)dVar23 < (ulong)local_118->JOINT_NUM);
    }
    pvVar14 = local_1a0;
    local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = 1.0;
    local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         = 0.0;
    local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = 0.0;
    local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
         = 0.0;
    local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
         = 1.0;
    local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
         = 0.0;
    local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
         = 0.0;
    local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
         = 0.0;
    local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
         = 1.0;
    __position_00._M_current = *(Matrix<double,_3,_3,_0,_3,_3> **)(local_1a0 + 8);
    if (__position_00._M_current == *(Matrix<double,_3,_3,_0,_3,_3> **)(local_1a0 + 0x10)) {
      std::vector<Eigen::Matrix<double,3,3,0,3,3>,std::allocator<Eigen::Matrix<double,3,3,0,3,3>>>::
      _M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>(local_1a0,__position_00,&local_198);
    }
    else {
      pMVar20 = &local_198;
      for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
        ((__position_00._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[0] =
             (pMVar20->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
             m_data.array[0];
        pMVar20 = (Matrix<double,_3,_3,_0,_3,_3> *)((long)pMVar20 + ((ulong)bVar22 * -2 + 1) * 8);
        __position_00._M_current =
             (Matrix<double,_3,_3,_0,_3,_3> *)
             ((long)__position_00._M_current + ((ulong)bVar22 * -2 + 1) * 8);
      }
      *(long *)(local_1a0 + 8) = *(long *)(local_1a0 + 8) + 0x48;
    }
    pvVar15 = local_120;
    local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = 0.0;
    local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         = 0.0;
    local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = 0.0;
    __position._M_current = *(Matrix<double,_3,_1,_0,_3,_1> **)((long)P + 8);
    if (__position._M_current == *(Matrix<double,_3,_1,_0,_3,_1> **)((long)P + 0x10)) {
      std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
      _M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)P,__position,(Matrix<double,_3,_1,_0,_3,_1> *)&local_258);
    }
    else {
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
      m_storage.m_data.array[0] = 0.0;
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
      m_storage.m_data.array[1] = 0.0;
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
      m_storage.m_data.array[2] = 0.0;
      *(long *)((long)P + 8) = *(long *)((long)P + 8) + 0x18;
    }
    lVar17 = (long)(int)local_118->JOINT_NUM;
    if (0 < lVar17) {
      local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = (double)(local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array + 5);
      local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)(local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array + 1);
      lVar18 = lVar17 + 1;
      lVar21 = lVar17 * 9 + 8;
      lVar17 = lVar17 * 0x18;
      local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = (double)&local_278;
      local_210 = &local_1d8;
      do {
        lVar11 = *(long *)pvVar14;
        local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = (double)(local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array + 2);
        dVar23 = *(double *)
                  ((long)local_78.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array + lVar17);
        dVar5 = *(double *)
                 ((long)local_78.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + lVar17 + 8);
        dVar28 = *(double *)
                  ((long)local_78.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array + lVar17 + 0x10);
        pdVar2 = (double *)(lVar11 + -0x40 + lVar21 * 8);
        dVar13 = pdVar2[1];
        pdVar3 = (double *)(lVar11 + -0x28 + lVar21 * 8);
        dVar26 = pdVar3[1];
        pdVar4 = (double *)(lVar11 + -0x10 + lVar21 * 8);
        dVar30 = pdVar4[1];
        local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = dVar28 * *pdVar4 + dVar5 * *pdVar3 + *pdVar2 * dVar23;
        dVar27 = *(double *)(lVar11 + -0x30 + lVar21 * 8);
        dVar24 = *(double *)
                  ((long)local_78.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array + lVar17);
        dVar25 = *(double *)(lVar11 + -0x18 + lVar21 * 8);
        dVar29 = *(double *)(lVar11 + lVar21 * 8);
        dVar6 = *(double *)
                 ((long)local_78.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + lVar17 + 8);
        dVar7 = *(double *)
                 ((long)local_78.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + lVar17 + 0x10);
        pdVar2 = (double *)
                 ((long)((local_d8.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                        m_data.array + lVar17);
        dVar31 = pdVar2[1];
        pdVar3 = (double *)
                 ((long)((local_78.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                        m_data.array + lVar17);
        *pdVar3 = *pdVar2 + local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array[2];
        pdVar3[1] = dVar31 + dVar28 * dVar30 + dVar5 * dVar26 + dVar13 * dVar23;
        *(double *)
         ((long)((local_78.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         + lVar17 + 0x10) =
             dVar29 * dVar7 + dVar25 * dVar6 + dVar27 * dVar24 +
             *(double *)
              ((long)((local_d8.
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                     array + lVar17 + 0x10);
        pMVar9 = (local_118->PC).
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        dVar23 = *(double *)
                  ((long)&pMVar9[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data + lVar17);
        dVar5 = *(double *)
                 ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar17 + -0x10);
        dVar28 = *(double *)
                  ((long)((local_d8.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                         m_data.array + lVar17 + 0x10);
        dVar27 = *(double *)
                  ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                          m_storage.m_data + lVar17 + -8);
        dVar24 = *(double *)
                  ((long)((local_d8.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                         m_data.array + lVar17);
        dVar25 = *(double *)
                  ((long)((local_d8.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                         m_data.array + lVar17 + 8);
        lVar11 = *(long *)pvVar14;
        local_278.m_xpr = (XprTypeNested)(dVar5 * dVar28 - dVar25 * dVar27);
        pdStack_270 = (double *)(dVar27 * dVar24 - dVar28 * dVar23);
        local_268 = dVar25 * dVar23 - dVar24 * dVar5;
        dVar23 = *(double *)
                  ((long)local_78.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array + lVar17);
        dVar5 = *(double *)
                 ((long)local_78.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + lVar17 + 8);
        dVar28 = *(double *)
                  ((long)local_78.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array + lVar17 + 0x10);
        lVar12 = *(long *)P;
        pdVar2 = (double *)(lVar11 + -0x40 + lVar21 * 8);
        pdVar3 = (double *)(lVar11 + -0x28 + lVar21 * 8);
        pdVar4 = (double *)(lVar11 + -0x10 + lVar21 * 8);
        dVar27 = *(double *)(lVar12 + 8 + lVar17);
        dVar24 = *(double *)(lVar12 + 0x10 + lVar17);
        local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] = (double)((long)((local_60.
                                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                  m_storage.m_data.array + lVar17);
        dVar25 = dVar28 * *pdVar4 + dVar5 * *pdVar3 + *pdVar2 * dVar23;
        dVar29 = dVar28 * pdVar4[1] + dVar5 * pdVar3[1] + pdVar2[1] * dVar23;
        dVar23 = dVar28 * *(double *)(lVar11 + lVar21 * 8) +
                 dVar5 * *(double *)(lVar11 + -0x18 + lVar21 * 8) +
                 dVar23 * *(double *)(lVar11 + -0x30 + lVar21 * 8);
        local_1d8 = (XprTypeNested)(dVar27 * dVar23 - dVar29 * dVar24);
        pdStack_1d0 = (double *)(dVar24 * dVar25 - dVar23 * *(double *)(lVar12 + lVar17));
        local_1c8 = dVar29 * *(double *)(lVar12 + lVar17) - dVar25 * dVar27;
        dVar23 = *(double *)
                  ((long)local_90.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array + lVar17);
        dVar5 = *(double *)
                 ((long)local_90.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + lVar17 + 8);
        dVar28 = *(double *)
                  ((long)local_90.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array + lVar17 + 0x10);
        pdVar2 = (double *)(lVar11 + -0x40 + lVar21 * 8);
        pdVar3 = (double *)(lVar11 + -0x28 + lVar21 * 8);
        pdVar4 = (double *)(lVar11 + -0x10 + lVar21 * 8);
        local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] = dVar28 * *pdVar4 + dVar5 * *pdVar3 + *pdVar2 * dVar23;
        local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] = dVar28 * pdVar4[1] + dVar5 * pdVar3[1] + pdVar2[1] * dVar23;
        local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] = *(double *)(lVar11 + lVar21 * 8) *
                   *(double *)
                    ((long)local_90.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array + lVar17 + 0x10) +
                   *(double *)(lVar11 + -0x18 + lVar21 * 8) *
                   *(double *)
                    ((long)local_90.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array + lVar17 + 8) +
                   *(double *)(lVar11 + -0x30 + lVar21 * 8) *
                   *(double *)
                    ((long)local_90.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array + lVar17);
        pdVar2 = (double *)
                 ((long)((local_60.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                        m_data.array + lVar17);
        dVar23 = pdVar2[1];
        pdVar3 = (double *)
                 ((long)((local_90.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                        m_data.array + lVar17);
        *pdVar3 = *pdVar2 + local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array[5] + (double)local_278.m_xpr + (double)local_1d8;
        pdVar3[1] = dVar23 + local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array[6] + (double)pdStack_270 + (double)pdStack_1d0;
        *(double *)
         ((long)((local_90.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         + lVar17 + 0x10) =
             local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] +
             *(double *)
              ((long)((local_60.
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                     array + lVar17 + 0x10) + local_268 + local_1c8;
        pdVar2 = (double *)
                 ((long)((local_90.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                        m_data.array + lVar17);
        (pvVar15->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar18 + -2] =
             (local_118->damping).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar18 + -2] *
             (theta_d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar18 + -2] +
             *(double *)
              ((long)((local_90.
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                     array + lVar17 + 0x10) * local_1a8 +
             pdVar2[1] * dStack_1b0 + *pdVar2 * local_1b8;
        lVar18 = lVar18 + -1;
        lVar21 = lVar21 + -9;
        lVar17 = lVar17 + -0x18;
      } while (1 < lVar18);
    }
    if (local_90.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_78.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_60.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_d8.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_c0.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_108.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_f0.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f0.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    return pvVar15;
  }
  __assert_fail("JOINT_NUM == theta_dd.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/notlixiang[P]Robot-Arm-Dynamics-Library/RobotDynamics.cpp"
                ,0x1d,
                "vector<double> RobotDynamics::getTau(double, vector<Eigen::Matrix3d>, vector<Eigen::Vector3d>, vector<double>, vector<double>)"
               );
}

Assistant:

vector<double> RobotDynamics::
getTau(double G, vector<Eigen::Matrix3d> R, vector<Eigen::Vector3d> P,
       vector<double> theta_d, vector<double> theta_dd)
{
    assert(JOINT_NUM == R.size());
    assert(JOINT_NUM == P.size());
    assert(JOINT_NUM == theta_d.size());
    assert(JOINT_NUM == theta_dd.size());

    vector<Eigen::Vector3d> w(JOINT_NUM + 1);
    vector<Eigen::Vector3d> w_d(JOINT_NUM + 1);
    vector<Eigen::Vector3d> v_d(JOINT_NUM + 1);
    vector<Eigen::Vector3d> vC_d(JOINT_NUM + 1);
    vector<Eigen::Vector3d> F(JOINT_NUM + 1);
    vector<Eigen::Vector3d> N(JOINT_NUM + 1);
    vector<Eigen::Vector3d> f(JOINT_NUM + 2);
    vector<Eigen::Vector3d> n(JOINT_NUM + 2);
    for (int i = 0; i < JOINT_NUM + 1; i++)
    {
        w[i].setZero();
        w_d[i].setZero();
        v_d[i].setZero();
        vC_d[i].setZero();
        F[i].setZero();
        N[i].setZero();
    }
    for (int i = 0; i < JOINT_NUM + 2; i++)
    {
        f[i].setZero();
        n[i].setZero();
    }
    vector<double> tau(JOINT_NUM);
    Eigen::Vector3d Z(0, 0, 1);
    v_d[0] = Eigen::Vector3d(0, 0, G);
    for (int i = 0; i < JOINT_NUM; i++)
    {
        w[i + 1] = R[i].inverse() * w[i] + theta_d[i] * Z;
        w_d[i + 1] = R[i].inverse() * w_d[i] + (R[i].inverse() * w[i]).cross(theta_d[i] * Z) + theta_dd[i] * Z;
        v_d[i + 1] = R[i].inverse() * (w_d[i].cross(P[i]) + w[i].cross(w[i].cross(P[i])) + v_d[i]);
        vC_d[i + 1] = w_d[i + 1].cross(PC[i]) + w[i + 1].cross(w[i + 1].cross(PC[i])) + v_d[i + 1];
        F[i + 1] = m[i] * vC_d[i + 1];
        N[i + 1] = I[i] * w_d[i + 1] + w[i + 1].cross(I[i] * w[i + 1]);
    }
    Eigen::Matrix3d identity_mat;
    identity_mat.setIdentity();
    R.push_back(identity_mat);
    P.push_back(Eigen::Vector3d(0, 0, 0));
    for (int i = JOINT_NUM; i >= 1; i--)
    {
        f[i] = R[i] * f[i + 1] + F[i];
        n[i] = N[i] + R[i] * n[i + 1] + PC[i - 1].cross(F[i]) + P[i].cross(R[i] * f[i + 1]);
        tau[i - 1] = n[i].transpose() * Z + damping[i - 1] * theta_d[i - 1];
    }
    return tau;
}